

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O1

int md_scan_for_html_closer
              (MD_CTX *ctx,MD_CHAR *str,MD_SIZE len,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,
              MD_OFFSET max_end,MD_OFFSET *p_end,MD_OFFSET *p_scan_horizon)

{
  MD_CHAR *pMVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint local_54;
  
  uVar6 = (ulong)beg;
  if (beg < *p_scan_horizon && max_end - len <= *p_scan_horizon) {
    return 0;
  }
  uVar4 = 0;
  do {
    uVar5 = (uint)uVar6;
    uVar2 = lines[uVar4].end;
    if (max_end <= lines[uVar4].end) {
      uVar2 = max_end;
    }
    local_54 = uVar5 + len;
    if (local_54 <= uVar2) {
      pMVar1 = ctx->text;
      iVar3 = bcmp(pMVar1 + uVar6,str,(ulong)len);
      if (iVar3 == 0) {
LAB_005dbe7d:
        *p_end = local_54;
        return 1;
      }
      uVar5 = uVar5 + 1;
      while (len + uVar5 <= uVar2) {
        iVar3 = bcmp(pMVar1 + uVar5,str,(ulong)len);
        uVar5 = uVar5 + 1;
        if (iVar3 == 0) {
          local_54 = (len + uVar5) - 1;
          goto LAB_005dbe7d;
        }
      }
    }
    uVar4 = uVar4 + 1;
    if ((n_lines <= uVar4) || (max_end <= uVar5)) {
      *p_scan_horizon = uVar5;
      return 0;
    }
    uVar6 = (ulong)lines[uVar4].beg;
  } while( true );
}

Assistant:

static int
md_scan_for_html_closer(MD_CTX* ctx, const MD_CHAR* str, MD_SIZE len,
                        const MD_LINE* lines, MD_SIZE n_lines,
                        OFF beg, OFF max_end, OFF* p_end,
                        OFF* p_scan_horizon)
{
    OFF off = beg;
    MD_SIZE line_index = 0;

    if(off < *p_scan_horizon  &&  *p_scan_horizon >= max_end - len) {
        /* We have already scanned the range up to the max_end so we know
         * there is nothing to see. */
        return FALSE;
    }

    while(TRUE) {
        while(off + len <= lines[line_index].end  &&  off + len <= max_end) {
            if(md_ascii_eq(STR(off), str, len)) {
                /* Success. */
                *p_end = off + len;
                return TRUE;
            }
            off++;
        }

        line_index++;
        if(off >= max_end  ||  line_index >= n_lines) {
            /* Failure. */
            *p_scan_horizon = off;
            return FALSE;
        }

        off = lines[line_index].beg;
    }
}